

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

int __thiscall zmq::session_base_t::push_msg(session_base_t *this,msg_t *msg_)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  int *piVar6;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  char *errstr;
  int rc;
  int local_4;
  
  bVar1 = msg_t::flags((msg_t *)in_RSI);
  __buf = extraout_RDX;
  if ((((bVar1 & 2) == 0) ||
      (bVar2 = msg_t::is_subscribe((msg_t *)in_RSI), __buf = extraout_RDX_00, bVar2)) ||
     (bVar2 = msg_t::is_cancel((msg_t *)in_RSI), __buf = extraout_RDX_01, bVar2)) {
    if ((*(long *)(in_RDI + 0x588) == 0) ||
       (ctx = in_RSI, uVar4 = pipe_t::write(*(pipe_t **)(in_RDI + 0x588),(int)in_RSI,__buf,in_RCX),
       (uVar4 & 1) == 0)) {
      piVar6 = __errno_location();
      *piVar6 = 0xb;
      local_4 = -1;
    }
    else {
      iVar3 = msg_t::init((msg_t *)in_RSI,ctx);
      if (iVar3 != 0) {
        piVar6 = __errno_location();
        pcVar5 = strerror(*piVar6);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0xbf);
        fflush(_stderr);
        zmq_abort((char *)0x302b27);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::session_base_t::push_msg (msg_t *msg_)
{
    //  pass subscribe/cancel to the sockets
    if ((msg_->flags () & msg_t::command) && !msg_->is_subscribe ()
        && !msg_->is_cancel ())
        return 0;
    if (_pipe && _pipe->write (msg_)) {
        const int rc = msg_->init ();
        errno_assert (rc == 0);
        return 0;
    }

    errno = EAGAIN;
    return -1;
}